

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall Engine_testSetDoubleNoTags_Test::TestBody(Engine_testSetDoubleNoTags_Test *this)

{
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar1;
  long lVar2;
  char *pcVar3;
  AssertHelper local_c8;
  AssertHelper local_c0;
  AssertionResult gtest_ar_1;
  _Head_base<0UL,_Handler_*,_false> local_a8;
  value_type im;
  Engine e;
  
  std::make_unique<TestHandler>();
  local_a8._M_head_impl = (Handler *)im.time;
  im.time.__d.__r = (duration)0;
  Engine::Engine(&e,"test",(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_a8);
  if (local_a8._M_head_impl != (Handler *)0x0) {
    (*(local_a8._M_head_impl)->_vptr_Handler[3])();
  }
  local_a8._M_head_impl = (Handler *)0x0;
  if (im.time.__d.__r != 0) {
    (**(code **)(*(long *)im.time.__d.__r + 0x18))();
  }
  std::__cxx11::string::string((string *)&im,"gauge.value",(allocator *)&local_c8);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0x405900083126e9;
  Engine::Set<double,_nullptr>(&e,(string *)&im,(double *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&im);
  pvVar1 = Engine::GetHandlers(&e);
  lVar2 = __dynamic_cast((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
                         (((pvVar1->
                           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t,
                         &Handler::typeinfo,&TestHandler::typeinfo,0);
  local_c8.data_._0_4_ = 1;
  gtest_ar_1._0_8_ = (*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20)) / 0x58;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&im,"1","th->doubleMeasures.size()",(int *)&local_c8,
             (unsigned_long *)&gtest_ar_1);
  if ((char)im.time.__d.__r == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (im.name._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)im.name._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x102,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&im.name);
    goto LAB_00118003;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&im.name);
  Measure<double>::Measure(&im,*(Measure<double> **)(lVar2 + 0x20));
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"test.gauge.value\"","im.name",
             (char (*) [17])"test.gauge.value",&im.name);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x104,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
LAB_00117fda:
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_c8.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<MetricTypes::MetricType,MetricTypes::MetricType>
              ((internal *)&gtest_ar_1,"MetricType::Gauge","im.type",(MetricType *)&local_c8,
               &im.type);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x105,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      goto LAB_00117fda;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_c8.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,float>
              ((internal *)&gtest_ar_1,"1","im.rate",(int *)&local_c8,&im.rate);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x106,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      goto LAB_00117fda;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_c8.data_ = (AssertHelperData *)0x405900083126e979;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_1,"100.0005","im.value",(double *)&local_c8,&im.value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x107,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      goto LAB_00117fda;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_c0.data_._0_4_ = 0;
    local_c8.data_ =
         (AssertHelperData *)
         ((long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start >> 6);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_1,"0","im.tags.size()",(int *)&local_c0,
               (unsigned_long *)&local_c8);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x108,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_c8);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  Measure<double>::~Measure(&im);
LAB_00118003:
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testSetDoubleNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Set("gauge.value", 100.0005);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(0, im.tags.size());
}